

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_get_string(exr_const_context_t ctxt,int part_index,char *name,int32_t *length,char **out)

{
  exr_result_t eVar1;
  exr_attribute_t *in_RAX;
  exr_attribute_t *attr;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar1;
    }
    if ((name == (char *)0x0) || (*name == '\0')) {
      eVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid name for string attribute query");
      return eVar1;
    }
    attr = in_RAX;
    eVar1 = exr_attr_list_find_by_name
                      (ctxt,(exr_attribute_list_t *)
                            (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8),
                       name,&attr);
    if (eVar1 == 0) {
      if (attr->type == EXR_ATTR_STRING) {
        if (length != (int32_t *)0x0) {
          *length = ((attr->field_6).chlist)->num_channels;
        }
        eVar1 = 0;
        if (out != (char **)0x0) {
          *out = (char *)(((attr->field_6).box2i)->max).field_0;
        }
      }
      else {
        eVar1 = (**(code **)(ctxt + 0x48))
                          (ctxt,0x10,
                           "\'%s\' requested type \'string\', but stored attributes is type \'%s\'",
                           name,attr->type_name);
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_get_string (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    int32_t*            length,
    const char**        out)
{
    ATTR_FIND_ATTR (EXR_ATTR_STRING, string);
    if (length) *length = attr->string->length;
    if (out) *out = attr->string->str;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}